

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O1

void __thiscall
duckdb::ART::VerifyLeaf
          (ART *this,Node *leaf,ARTKey *key,optional_ptr<duckdb::ART,_true> delete_art,
          ConflictManager *manager,optional_idx *conflict_idx,idx_t i)

{
  optional_ptr<duckdb::ART,_true> this_00;
  bool bVar1;
  unsafe_optional_ptr<const_Node> uVar2;
  InternalException *this_01;
  ulong uVar3;
  unsafe_vector<row_t> row_ids;
  ARTKey empty_key;
  Iterator it;
  string local_118;
  unsafe_vector<row_t> local_f8;
  ART *local_e0;
  ConflictManager *local_d8;
  optional_ptr<duckdb::ART,_true> local_d0;
  ARTKey local_c8;
  Iterator local_b8;
  
  uVar3 = (leaf->super_IndexPointer).data;
  local_d0.ptr = delete_art.ptr;
  if ((uVar3 & 0x7f00000000000000) == 0x700000000000000 && delete_art.ptr == (ART *)0x0) {
    bVar1 = ConflictManager::AddHit(manager,i,uVar3 & 0xffffffffffffff);
    if (!bVar1) {
      return;
    }
    optional_idx::optional_idx((optional_idx *)&local_b8,i);
    goto LAB_01715f0f;
  }
  if (delete_art.ptr == (ART *)0x0) {
    uVar2.ptr = (Node *)0x0;
  }
  else {
    local_e0 = this;
    optional_ptr<duckdb::ART,_true>::CheckValid(&local_d0);
    this_00 = local_d0;
    local_d8 = manager;
    optional_ptr<duckdb::ART,_true>::CheckValid(&local_d0);
    manager = local_d8;
    uVar2 = Lookup(this_00.ptr,&(local_d0.ptr)->tree,key,0);
    this = local_e0;
  }
  uVar3 = (leaf->super_IndexPointer).data;
  if ((uVar3 & 0x7f00000000000000) == 0x700000000000000 && uVar2.ptr == (Node *)0x0) {
    uVar3 = uVar3 & 0xffffffffffffff;
LAB_01715ef3:
    bVar1 = ConflictManager::AddHit(manager,i,uVar3);
  }
  else {
    if (uVar2.ptr == (Node *)0x0 || (uVar3 & 0x7f00000000000000) != 0x700000000000000) {
      if ((this->super_BoundIndex).index_constraint_type != FOREIGN) {
        Iterator::Iterator(&local_b8,this);
        Iterator::FindMinimum(&local_b8,leaf);
        ARTKey::ARTKey(&local_c8);
        local_f8.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        local_f8.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_f8.super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        bVar1 = Iterator::Scan(&local_b8,&local_c8,2,&local_f8,false);
        if ((!bVar1) ||
           ((long)local_f8.super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)local_f8.super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start != 0x10)) {
          this_01 = (InternalException *)__cxa_allocate_exception(0x10);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"VerifyLeaf expects exactly two row IDs to be scanned","")
          ;
          InternalException::InternalException(this_01,&local_118);
          __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (uVar2.ptr == (Node *)0x0) {
          bVar1 = ConflictManager::AddHit
                            (manager,i,
                             *local_f8.super_vector<long,_std::allocator<long>_>.
                              super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
          if ((!bVar1) &&
             (bVar1 = ConflictManager::AddHit
                                (manager,i,
                                 local_f8.super_vector<long,_std::allocator<long>_>.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start[1]), !bVar1)) goto LAB_0171608a;
          optional_idx::optional_idx((optional_idx *)&local_118,i);
        }
        else {
          uVar3 = ((uVar2.ptr)->super_IndexPointer).data & 0xffffffffffffff;
          if ((uVar3 == *local_f8.super_vector<long,_std::allocator<long>_>.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start) ||
             (uVar3 == local_f8.super_vector<long,_std::allocator<long>_>.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start[1])) {
            bVar1 = ConflictManager::AddMiss(manager,i);
            if (!bVar1) goto LAB_0171608a;
            optional_idx::optional_idx((optional_idx *)&local_118,i);
          }
          else {
            bVar1 = ConflictManager::AddHit
                              (manager,i,
                               *local_f8.super_vector<long,_std::allocator<long>_>.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start);
            if ((!bVar1) &&
               (bVar1 = ConflictManager::AddHit
                                  (manager,i,
                                   local_f8.super_vector<long,_std::allocator<long>_>.
                                   super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                   super__Vector_impl_data._M_start[1]), !bVar1)) goto LAB_0171608a;
            optional_idx::optional_idx((optional_idx *)&local_118,i);
          }
        }
        conflict_idx->index = (idx_t)local_118._M_dataplus._M_p;
LAB_0171608a:
        if ((ulong *)local_f8.super_vector<long,_std::allocator<long>_>.
                     super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
                     ._M_start != (ulong *)0x0) {
          operator_delete(local_f8.super_vector<long,_std::allocator<long>_>.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        ::std::_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::
        ~_Deque_base((_Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_> *)
                     &local_b8.nodes);
        if (local_b8.current_key.key_bytes.
            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return;
        }
        operator_delete(local_b8.current_key.key_bytes.
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
        return;
      }
      uVar3 = 0x7ffffffffff080;
      goto LAB_01715ef3;
    }
    uVar3 = uVar3 & 0xffffffffffffff;
    if ((((uVar2.ptr)->super_IndexPointer).data & 0xffffffffffffff) != uVar3) goto LAB_01715ef3;
    bVar1 = ConflictManager::AddMiss(manager,i);
  }
  if (bVar1 == false) {
    return;
  }
  optional_idx::optional_idx((optional_idx *)&local_b8,i);
LAB_01715f0f:
  conflict_idx->index =
       (idx_t)local_b8.current_key.key_bytes.
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  return;
}

Assistant:

void ART::VerifyLeaf(const Node &leaf, const ARTKey &key, optional_ptr<ART> delete_art, ConflictManager &manager,
                     optional_idx &conflict_idx, idx_t i) {
	// Fast path, the leaf is inlined, and the delete ART does not exist.
	if (leaf.GetType() == NType::LEAF_INLINED && !delete_art) {
		if (manager.AddHit(i, leaf.GetRowId())) {
			conflict_idx = i;
		}
		return;
	}

	// Get the delete_leaf.
	// All leaves in the delete ART are inlined.
	unsafe_optional_ptr<const Node> deleted_leaf;
	if (delete_art) {
		deleted_leaf = delete_art->Lookup(delete_art->tree, key, 0);
	}

	// The leaf is inlined, and there is no deleted leaf with the same key.
	if (leaf.GetType() == NType::LEAF_INLINED && !deleted_leaf) {
		if (manager.AddHit(i, leaf.GetRowId())) {
			conflict_idx = i;
		}
		return;
	}

	// The leaf is inlined, and the same key exists in the delete ART.
	if (leaf.GetType() == NType::LEAF_INLINED && deleted_leaf) {
		D_ASSERT(deleted_leaf->GetType() == NType::LEAF_INLINED);
		auto deleted_row_id = deleted_leaf->GetRowId();
		auto this_row_id = leaf.GetRowId();

		if (deleted_row_id == this_row_id) {
			if (manager.AddMiss(i)) {
				conflict_idx = i;
			}
			return;
		}

		if (manager.AddHit(i, this_row_id)) {
			conflict_idx = i;
		}
		return;
	}

	// Fast path for FOREIGN KEY constraints.
	// Up to here, the above code paths work implicitly for FKs, as the leaf is inlined.
	// FIXME: proper foreign key + delete ART support.
	if (index_constraint_type == IndexConstraintType::FOREIGN) {
		D_ASSERT(!deleted_leaf);
		// We don't handle FK conflicts in UPSERT, so the row ID should not matter.
		if (manager.AddHit(i, MAX_ROW_ID)) {
			conflict_idx = i;
		}
		return;
	}

	// Scan the two row IDs in the leaf.
	Iterator it(*this);
	it.FindMinimum(leaf);
	ARTKey empty_key = ARTKey();
	unsafe_vector<row_t> row_ids;
	auto success = it.Scan(empty_key, 2, row_ids, false);
	if (!success || row_ids.size() != 2) {
		throw InternalException("VerifyLeaf expects exactly two row IDs to be scanned");
	}

	if (!deleted_leaf) {
		if (manager.AddHit(i, row_ids[0]) || manager.AddHit(i, row_ids[1])) {
			conflict_idx = i;
		}
		return;
	}

	auto deleted_row_id = deleted_leaf->GetRowId();
	if (deleted_row_id == row_ids[0] || deleted_row_id == row_ids[1]) {
		if (manager.AddMiss(i)) {
			conflict_idx = i;
		}
		return;
	}

	if (manager.AddHit(i, row_ids[0]) || manager.AddHit(i, row_ids[1])) {
		conflict_idx = i;
	}
}